

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::inc_e(CPU *this)

{
  inc_r8(this,&this->regs->e);
  return 1;
}

Assistant:

int CPU::inc_e() {
    inc_r8(regs.e);
    return 1;
}